

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

void Diligent::anon_unknown_231::InitPipelineShaderStages
               (VulkanLogicalDevice *LogicalDevice,TShaderStages *ShaderStages,
               vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
               *ShaderModules,
               vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               *Stages)

{
  SHADER_TYPE ShaderType;
  pointer pSVar1;
  long lVar2;
  ShaderVkImpl *this;
  VkShaderStageFlagBits VVar3;
  char (*Args_1) [38];
  char (*Args_1_00) [32];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  string msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> SPIRV;
  VkShaderModuleCreateInfo local_78;
  ShaderModuleWrapper local_48;
  
  uVar5 = 0;
  while( true ) {
    pSVar1 = (ShaderStages->
             super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(ShaderStages->
                       super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x38) <= uVar5)
    break;
    ShaderType = pSVar1[uVar5].Type;
    Args_1_00 = (char (*) [32])
                ((long)*(pointer *)
                        ((long)&pSVar1[uVar5].Shaders.
                                super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                                ._M_impl + 8) -
                 *(long *)&pSVar1[uVar5].Shaders.
                           super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                           ._M_impl >> 3);
    if (Args_1_00 !=
        (char (*) [32])
        (((long)*(pointer *)
                 ((long)&pSVar1[uVar5].SPIRVs.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl + 8) -
         *(long *)&pSVar1[uVar5].SPIRVs.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl) / 0x18)) {
      FormatString<char[26],char[32]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Shaders.size() == SPIRVs.size()",Args_1_00);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"InitPipelineShaderStages",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x45);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_string_length = 0;
    msg.field_2._8_8_ = 0;
    msg._M_dataplus._M_p = (pointer)0x12;
    msg.field_2._M_allocated_capacity = 0;
    VVar3 = ShaderTypeToVkShaderStageFlagBit(ShaderType);
    local_78.pNext = (void *)0x0;
    local_78.codeSize = 0;
    local_78.pCode = (pointer)0x0;
    local_78.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    local_78._4_4_ = 0;
    local_78.flags = 0;
    local_78._20_4_ = 0;
    msg.field_2._M_allocated_capacity._4_4_ = VVar3;
    lVar4 = 0;
    for (uVar6 = 0;
        lVar2 = *(long *)&pSVar1[uVar5].Shaders.
                          super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                          ._M_impl.super__Vector_impl_data,
        uVar6 < (ulong)((long)*(pointer *)
                               ((long)&pSVar1[uVar5].Shaders.
                                       super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                                       ._M_impl + 8) - lVar2 >> 3); uVar6 = uVar6 + 1) {
      this = *(ShaderVkImpl **)(lVar2 + uVar6 * 8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&SPIRV,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        (*(long *)&pSVar1[uVar5].SPIRVs.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data + lVar4));
      local_78.codeSize =
           (long)SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78.pCode =
           SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      VulkanUtilities::VulkanLogicalDevice::CreateShaderModule
                (&local_48,LogicalDevice,&local_78,
                 (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                 .m_Desc.super_DeviceObjectAttribs.Name);
      std::
      vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>>>
      ::
      emplace_back<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>>
                ((vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10>>>
                  *)ShaderModules,&local_48);
      VulkanUtilities::
      VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>::
      ~VulkanObjectWrapper(&local_48);
      msg.field_2._8_8_ =
           (ShaderModules->
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1].m_VkObject;
      ShaderVkImpl::GetEntryPoint(this);
      std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
      ::push_back(Stages,(value_type *)&msg);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      lVar4 = lVar4 + 0x18;
    }
    uVar5 = uVar5 + 1;
  }
  Args_1 = (char (*) [38])
           (((long)(ShaderModules->
                   super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(ShaderModules->
                  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  if (Args_1 != (char (*) [38])
                (((long)(Stages->
                        super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(Stages->
                       super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
    FormatString<char[26],char[38]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderModules.size() == Stages.size()",Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitPipelineShaderStages",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,100);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void InitPipelineShaderStages(const VulkanUtilities::VulkanLogicalDevice&        LogicalDevice,
                              PipelineStateVkImpl::TShaderStages&                ShaderStages,
                              std::vector<VulkanUtilities::ShaderModuleWrapper>& ShaderModules,
                              std::vector<VkPipelineShaderStageCreateInfo>&      Stages)
{
    for (size_t s = 0; s < ShaderStages.size(); ++s)
    {
        const std::vector<const ShaderVkImpl*>& Shaders    = ShaderStages[s].Shaders;
        std::vector<std::vector<uint32_t>>&     SPIRVs     = ShaderStages[s].SPIRVs;
        const SHADER_TYPE                       ShaderType = ShaderStages[s].Type;

        VERIFY_EXPR(Shaders.size() == SPIRVs.size());

        VkPipelineShaderStageCreateInfo StageCI{};
        StageCI.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
        StageCI.pNext = nullptr;
        StageCI.flags = 0; //  reserved for future use
        StageCI.stage = ShaderTypeToVkShaderStageFlagBit(ShaderType);

        VkShaderModuleCreateInfo ShaderModuleCI{};
        ShaderModuleCI.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
        ShaderModuleCI.pNext = nullptr;
        ShaderModuleCI.flags = 0;

        for (size_t i = 0; i < Shaders.size(); ++i)
        {
            const ShaderVkImpl*         pShader = Shaders[i];
            const std::vector<uint32_t> SPIRV   = SPIRVs[i];

            ShaderModuleCI.codeSize = SPIRV.size() * sizeof(uint32_t);
            ShaderModuleCI.pCode    = SPIRV.data();

            ShaderModules.push_back(LogicalDevice.CreateShaderModule(ShaderModuleCI, pShader->GetDesc().Name));

            StageCI.module              = ShaderModules.back();
            StageCI.pName               = pShader->GetEntryPoint();
            StageCI.pSpecializationInfo = nullptr;

            Stages.push_back(StageCI);
        }
    }

    VERIFY_EXPR(ShaderModules.size() == Stages.size());
}